

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icupkg.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  UBool UVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  char *pcVar7;
  Package *this;
  size_t sVar8;
  Package *pPVar9;
  Package *pPVar10;
  FileStream *fileStream;
  Item *pIVar11;
  undefined8 extraout_RAX;
  bool bVar12;
  char *filesPath;
  char *__s1;
  char *outComment;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  char suffix [6];
  char outFilenameBuffer [1024];
  byte local_460;
  int local_45c;
  Package *local_458;
  int local_450;
  undefined8 local_440;
  char local_438 [1032];
  
  pcVar7 = findBasename(*argv);
  iVar4 = u_parseArgs(argc,argv,0x11,options);
  if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') {
    printUsage(pcVar7,'\x01');
    return 0;
  }
  this = (Package *)operator_new(0x31218);
  icu_63::Package::Package(this);
  bVar13 = options[0xe].doesOccur != '\0';
  if ((bool)bVar13) {
    this->doAutoPrefix = '\x01';
  }
  if (options[0xf].doesOccur != '\0') {
    if (options[0x10].doesOccur != '\0') {
      main_cold_1();
      return 1;
    }
    this->doAutoPrefix = '\x01';
    this->prefixEndsWithType = '\x01';
    bVar13 = bVar13 + 1;
  }
  if ((iVar4 - 4U < 0xfffffffe) || (1 < bVar13)) goto LAB_001e6935;
  local_458 = (Package *)0x0;
  if (options[5].doesOccur != '\0') {
    local_458 = (Package *)options[5].value;
  }
  filesPath = (char *)0x0;
  if (options[6].doesOccur != '\0') {
    filesPath = options[6].value;
  }
  __s1 = argv[1];
  iVar5 = strcmp(__s1,"new");
  if (iVar5 == 0) {
    if (bVar13 != 0) {
      main_cold_2();
      return 1;
    }
    __s1 = (char *)0x0;
LAB_001e64af:
    bVar1 = false;
  }
  else {
    sVar8 = strlen(__s1);
    if ((4 < (int)sVar8) && (iVar5 = strcmp(__s1 + ((int)sVar8 - 4),".dat"), iVar5 == 0)) {
      icu_63::Package::readPackage(this,__s1);
      goto LAB_001e64af;
    }
    icu_63::Package::addFile(this,local_458->inPkgName,__s1);
    bVar1 = true;
  }
  if (iVar4 < 3) {
    local_440 = (char *)0x0;
    if (bVar1) {
      local_440 = __s1;
    }
    bVar14 = (bool)(local_458 != (Package *)filesPath & bVar1);
  }
  else {
    local_440 = argv[2];
    iVar4 = strcmp(argv[1],local_440);
    bVar14 = iVar4 != 0;
  }
  if (options[2].doesOccur == '\0') {
    local_45c = 0;
    if (bVar1) {
      local_460 = 0;
    }
    else {
      local_460 = icu_63::Package::getInType(this);
    }
  }
  else {
    local_460 = *options[2].value;
    if ((((local_460 == 0) || (options[2].value[1] != '\0')) || (10 < local_460 - 0x62)) ||
       ((0x409U >> (local_460 - 0x62 & 0x1f) & 1) == 0)) {
      bVar12 = false;
      fprintf(_stderr,
              "%csage: %s [-h|-?|--help ] [-tl|-tb|-te] [-c] [-C comment]\n\t[-a list] [-r list] [-x list] [-l [-o outputListFileName]]\n\t[-s path] [-d path] [-w] [-m mode]\n\t[--auto_toc_prefix] [--auto_toc_prefix_with_type] [--toc_prefix]\n\tinfilename [outfilename]\n"
              ,0x75);
      local_45c = 1;
    }
    else {
      bVar12 = true;
      bVar15 = true;
      if (!bVar1) {
        bVar13 = icu_63::Package::getInType(this);
        bVar15 = local_460 != bVar13;
      }
      bVar14 = (bool)(bVar14 | bVar15);
      local_45c = 0;
    }
    if (!bVar12) {
      return local_45c;
    }
  }
  bVar12 = true;
  if (options[7].doesOccur == '\0') {
    bVar12 = bVar14;
  }
  if (bVar1) {
    if (((((options[4].doesOccur == '\0') && (options[3].doesOccur == '\0')) &&
         (options[8].doesOccur == '\0')) &&
        ((options[10].doesOccur == '\0' && (options[9].doesOccur == '\0')))) &&
       ((options[0xb].doesOccur == '\0' && (options[0xc].doesOccur == '\0')))) {
      if (bVar12) {
        icu_63::Package::extractItem(this,filesPath,local_440,0,local_460);
      }
      icu_63::Package::~Package(this);
      operator_delete(this);
      return 0;
    }
LAB_001e6935:
    fprintf(_stderr,
            "%csage: %s [-h|-?|--help ] [-tl|-tb|-te] [-c] [-C comment]\n\t[-a list] [-r list] [-x list] [-l [-o outputListFileName]]\n\t[-s path] [-d path] [-w] [-m mode]\n\t[--auto_toc_prefix] [--auto_toc_prefix_with_type] [--toc_prefix]\n\tinfilename [outfilename]\n"
            ,0x75,pcVar7);
    return 1;
  }
  outComment = (char *)0x0;
  if (options[3].doesOccur != '\0') {
    outComment = 
    " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
    ;
  }
  if (options[4].doesOccur != '\0') {
    outComment = options[4].value;
  }
  if (options[8].doesOccur != '\0') {
    iVar4 = strcmp(options[8].value,"noslash");
    if (iVar4 != 0) goto LAB_001e6935;
    icu_63::Package::setMatchMode(this,1);
  }
  if (options[10].doesOccur != '\0') {
    pPVar9 = (Package *)operator_new(0x31218);
    icu_63::Package::Package(pPVar9);
    pPVar10 = readList((char *)0x0,options[10].value,'\0',pPVar9);
    if (pPVar10 == (Package *)0x0) goto LAB_001e6935;
    icu_63::Package::removeItems(this,pPVar9);
    icu_63::Package::~Package(pPVar9);
    operator_delete(pPVar9);
    bVar12 = true;
  }
  if (options[9].doesOccur == '\0') {
    local_458 = (Package *)0x0;
  }
  else {
    pPVar9 = (Package *)operator_new(0x31218);
    icu_63::Package::Package(pPVar9);
    pPVar10 = readList(local_458->inPkgName,options[9].value,'\x01',pPVar9);
    if (pPVar10 == (Package *)0x0) {
      fprintf(_stderr,
              "%csage: %s [-h|-?|--help ] [-tl|-tb|-te] [-c] [-C comment]\n\t[-a list] [-r list] [-x list] [-l [-o outputListFileName]]\n\t[-s path] [-d path] [-w] [-m mode]\n\t[--auto_toc_prefix] [--auto_toc_prefix_with_type] [--toc_prefix]\n\tinfilename [outfilename]\n"
              ,0x75,pcVar7);
      return 1;
    }
    icu_63::Package::addItems(this,pPVar9);
    bVar12 = true;
    local_458 = pPVar9;
  }
  if (options[0xb].doesOccur != '\0') {
    pPVar9 = (Package *)operator_new(0x31218);
    icu_63::Package::Package(pPVar9);
    pPVar10 = readList((char *)0x0,options[0xb].value,'\0',pPVar9);
    if (pPVar10 == (Package *)0x0) goto LAB_001e6935;
    icu_63::Package::extractItems(this,filesPath,pPVar9,local_460);
    icu_63::Package::~Package(pPVar9);
    operator_delete(pPVar9);
  }
  if (options[0xc].doesOccur != '\0') {
    if (options[0xd].doesOccur == '\0') {
      iVar6 = icu_63::Package::getItemCount(this);
      bVar1 = true;
      if (0 < iVar6) {
        iVar4 = 0;
        do {
          __stream = _stdout;
          pIVar11 = icu_63::Package::getItem(this,iVar4);
          fprintf(__stream,"%s\n",pIVar11->name);
          iVar4 = iVar4 + 1;
          iVar6 = icu_63::Package::getItemCount(this);
        } while (iVar4 < iVar6);
        bVar1 = true;
      }
    }
    else {
      fileStream = T_FileStream_open(options[0xd].value,"w");
      bVar1 = fileStream != (FileStream *)0x0;
      if (fileStream == (FileStream *)0x0) {
        local_45c = 1;
      }
      else {
        iVar6 = icu_63::Package::getItemCount(this);
        if (0 < iVar6) {
          iVar4 = 0;
          do {
            pIVar11 = icu_63::Package::getItem(this,iVar4);
            T_FileStream_writeLine(fileStream,pIVar11->name);
            T_FileStream_writeLine(fileStream,"\n");
            iVar4 = iVar4 + 1;
            iVar6 = icu_63::Package::getItemCount(this);
          } while (iVar4 < iVar6);
        }
        T_FileStream_close(fileStream);
      }
    }
    if (!bVar1) {
      return local_45c;
    }
  }
  UVar2 = icu_63::Package::checkDependencies(this);
  if (UVar2 == '\0') {
    return 2;
  }
  if (bVar12) {
    if ((local_440 == (char *)0x0) || (pcVar7 = local_440, *local_440 == '\0')) {
      if ((__s1 == (char *)0x0) || (*__s1 == '\0')) {
        main_cold_3();
        operator_delete(outComment);
        _Unwind_Resume(extraout_RAX);
      }
      cVar3 = icu_63::Package::getInType(this);
      local_450 = CONCAT31(0x61642e,cVar3);
      pcVar7 = local_438;
      strcpy(pcVar7,__s1);
      sVar8 = strlen(pcVar7);
      if ((5 < (long)sVar8) &&
         (local_438[sVar8 - 1] == 't' && *(int *)(local_438 + (sVar8 - 5)) == local_450)) {
        local_438[sVar8 - 5] = local_460;
      }
    }
    if (options[0x10].doesOccur != '\0') {
      icu_63::Package::setPrefix(this,options[0x10].value);
    }
    iVar4 = writePackageDatFile(pcVar7,outComment,(char *)0x0,(char *)0x0,this,local_460);
  }
  else {
    iVar4 = 0;
  }
  if (local_458 != (Package *)0x0) {
    icu_63::Package::~Package(local_458);
    operator_delete(local_458);
  }
  icu_63::Package::~Package(this);
  operator_delete(this);
  return iVar4;
}

Assistant:

extern int
main(int argc, char *argv[]) {
    const char *pname, *sourcePath, *destPath, *inFilename, *outFilename, *outComment;
    char outType;
    UBool isHelp, isModified, isPackage;
    int result = 0;

    Package *pkg, *listPkg, *addListPkg;

    U_MAIN_INIT_ARGS(argc, argv);

    /* get the program basename */
    pname=findBasename(argv[0]);

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    isHelp=options[OPT_HELP_H].doesOccur || options[OPT_HELP_QUESTION_MARK].doesOccur;
    if(isHelp) {
        printUsage(pname, TRUE);
        return U_ZERO_ERROR;
    }

    pkg=new Package;
    if(pkg==NULL) {
        fprintf(stderr, "icupkg: not enough memory\n");
        return U_MEMORY_ALLOCATION_ERROR;
    }
    isModified=FALSE;

    int autoPrefix=0;
    if(options[OPT_AUTO_TOC_PREFIX].doesOccur) {
        pkg->setAutoPrefix();
        ++autoPrefix;
    }
    if(options[OPT_AUTO_TOC_PREFIX_WITH_TYPE].doesOccur) {
        if(options[OPT_TOC_PREFIX].doesOccur) {
            fprintf(stderr, "icupkg: --auto_toc_prefix_with_type and also --toc_prefix\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        pkg->setAutoPrefixWithType();
        ++autoPrefix;
    }
    if(argc<2 || 3<argc || autoPrefix>1) {
        printUsage(pname, FALSE);
        return U_ILLEGAL_ARGUMENT_ERROR;
    }

    if(options[OPT_SOURCEDIR].doesOccur) {
        sourcePath=options[OPT_SOURCEDIR].value;
    } else {
        // work relative to the current working directory
        sourcePath=NULL;
    }
    if(options[OPT_DESTDIR].doesOccur) {
        destPath=options[OPT_DESTDIR].value;
    } else {
        // work relative to the current working directory
        destPath=NULL;
    }

    if(0==strcmp(argv[1], "new")) {
        if(autoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but no input package\n");
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        inFilename=NULL;
        isPackage=TRUE;
    } else {
        inFilename=argv[1];
        if(isPackageName(inFilename)) {
            pkg->readPackage(inFilename);
            isPackage=TRUE;
        } else {
            /* swap a single file (icuswap replacement) rather than work on a package */
            pkg->addFile(sourcePath, inFilename);
            isPackage=FALSE;
        }
    }

    if(argc>=3) {
        outFilename=argv[2];
        if(0!=strcmp(argv[1], argv[2])) {
            isModified=TRUE;
        }
    } else if(isPackage) {
        outFilename=NULL;
    } else /* !isPackage */ {
        outFilename=inFilename;
        isModified=(UBool)(sourcePath!=destPath);
    }

    /* parse the output type option */
    if(options[OPT_OUT_TYPE].doesOccur) {
        const char *type=options[OPT_OUT_TYPE].value;
        if(type[0]==0 || type[1]!=0) {
            /* the type must be exactly one letter */
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        outType=type[0];
        switch(outType) {
        case 'l':
        case 'b':
        case 'e':
            break;
        default:
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }

        /*
         * Set the isModified flag if the output type differs from the
         * input package type.
         * If we swap a single file, just assume that we are modifying it.
         * The Package class does not give us access to the item and its type.
         */
        isModified|=(UBool)(!isPackage || outType!=pkg->getInType());
    } else if(isPackage) {
        outType=pkg->getInType(); // default to input type
    } else /* !isPackage: swap single file */ {
        outType=0; /* tells extractItem() to not swap */
    }

    if(options[OPT_WRITEPKG].doesOccur) {
        isModified=TRUE;
    }

    if(!isPackage) {
        /*
         * icuswap tool replacement: Only swap a single file.
         * Check that irrelevant options are not set.
         */
        if( options[OPT_COMMENT].doesOccur ||
            options[OPT_COPYRIGHT].doesOccur ||
            options[OPT_MATCHMODE].doesOccur ||
            options[OPT_REMOVE_LIST].doesOccur ||
            options[OPT_ADD_LIST].doesOccur ||
            options[OPT_EXTRACT_LIST].doesOccur ||
            options[OPT_LIST_ITEMS].doesOccur
        ) {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
        if(isModified) {
            pkg->extractItem(destPath, outFilename, 0, outType);
        }

        delete pkg;
        return result;
    }

    /* Work with a package. */

    if(options[OPT_COMMENT].doesOccur) {
        outComment=options[OPT_COMMENT].value;
    } else if(options[OPT_COPYRIGHT].doesOccur) {
        outComment=U_COPYRIGHT_STRING;
    } else {
        outComment=NULL;
    }

    if(options[OPT_MATCHMODE].doesOccur) {
        if(0==strcmp(options[OPT_MATCHMODE].value, "noslash")) {
            pkg->setMatchMode(Package::MATCH_NOSLASH);
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* remove items */
    if(options[OPT_REMOVE_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_REMOVE_LIST].value, FALSE, listPkg)) {
            pkg->removeItems(*listPkg);
            delete listPkg;
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /*
     * add items
     * use a separate Package so that its memory and items stay around
     * as long as the main Package
     */
    addListPkg=NULL;
    if(options[OPT_ADD_LIST].doesOccur) {
        addListPkg=new Package();
        if(addListPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(sourcePath, options[OPT_ADD_LIST].value, TRUE, addListPkg)) {
            pkg->addItems(*addListPkg);
            // delete addListPkg; deferred until after writePackage()
            isModified=TRUE;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* extract items */
    if(options[OPT_EXTRACT_LIST].doesOccur) {
        listPkg=new Package();
        if(listPkg==NULL) {
            fprintf(stderr, "icupkg: not enough memory\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
        if(readList(NULL, options[OPT_EXTRACT_LIST].value, FALSE, listPkg)) {
            pkg->extractItems(destPath, *listPkg, outType);
            delete listPkg;
        } else {
            printUsage(pname, FALSE);
            return U_ILLEGAL_ARGUMENT_ERROR;
        }
    }

    /* list items */
    if(options[OPT_LIST_ITEMS].doesOccur) {
        int32_t i;
        if (options[OPT_LIST_FILE].doesOccur) {
            FileStream *out;
            out = T_FileStream_open(options[OPT_LIST_FILE].value, "w");
            if (out != NULL) {
                for(i=0; i<pkg->getItemCount(); ++i) {
                    T_FileStream_writeLine(out, pkg->getItem(i)->name);
                    T_FileStream_writeLine(out, "\n");
                }
                T_FileStream_close(out);
            } else {
                return U_ILLEGAL_ARGUMENT_ERROR;
            }
        } else {
            for(i=0; i<pkg->getItemCount(); ++i) {
                fprintf(stdout, "%s\n", pkg->getItem(i)->name);
            }
        }
    }

    /* check dependencies between items */
    if(!pkg->checkDependencies()) {
        /* some dependencies are not fulfilled */
        return U_MISSING_RESOURCE_ERROR;
    }

    /* write the output .dat package if there are any modifications */
    if(isModified) {
        char outFilenameBuffer[1024]; // for auto-generated output filename, if necessary

        if(outFilename==NULL || outFilename[0]==0) {
            if(inFilename==NULL || inFilename[0]==0) {
                fprintf(stderr, "icupkg: unable to auto-generate an output filename if there is no input filename\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }

            /*
             * auto-generate a filename:
             * copy the inFilename,
             * and if the last basename character matches the input file's type,
             * then replace it with the output file's type
             */
            char suffix[6]="?.dat";
            char *s;

            suffix[0]=pkg->getInType();
            strcpy(outFilenameBuffer, inFilename);
            s=strchr(outFilenameBuffer, 0);
            if((s-outFilenameBuffer)>5 && 0==memcmp(s-5, suffix, 5)) {
                *(s-5)=outType;
            }
            outFilename=outFilenameBuffer;
        }
        if(options[OPT_TOC_PREFIX].doesOccur) {
            pkg->setPrefix(options[OPT_TOC_PREFIX].value);
        }
        result = writePackageDatFile(outFilename, outComment, NULL, NULL, pkg, outType);
    }

    delete addListPkg;
    delete pkg;
    return result;
}